

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O0

_Bool kind_is_good(object_kind *kind)

{
  _Bool _Var1;
  int iVar2;
  object_kind *kind_local;
  
  iVar2 = kind->tval;
  if (iVar2 - 3U < 2) {
    kind_local._7_1_ = true;
  }
  else if (iVar2 - 5U < 5) {
    iVar2 = randcalc(kind->to_h,0,MINIMISE);
    if (iVar2 < 0) {
      kind_local._7_1_ = false;
    }
    else {
      iVar2 = randcalc(kind->to_d,0,MINIMISE);
      if (iVar2 < 0) {
        kind_local._7_1_ = false;
      }
      else {
        kind_local._7_1_ = true;
      }
    }
  }
  else if (iVar2 - 10U < 9) {
    iVar2 = randcalc(kind->to_a,0,MINIMISE);
    if (iVar2 < 0) {
      kind_local._7_1_ = false;
    }
    else {
      kind_local._7_1_ = true;
    }
  }
  else {
    _Var1 = flag_has_dbg(kind->kind_flags,4,0x15,"kind->kind_flags","KF_GOOD");
    if (_Var1) {
      kind_local._7_1_ = true;
    }
    else {
      kind_local._7_1_ = false;
    }
  }
  return kind_local._7_1_;
}

Assistant:

bool kind_is_good(const struct object_kind *kind)
{
	/* Some item types are (almost) always good */
	switch (kind->tval)
	{
		/* Armor -- Good unless damaged */
		case TV_HARD_ARMOR:
		case TV_SOFT_ARMOR:
		case TV_DRAG_ARMOR:
		case TV_SHIELD:
		case TV_CLOAK:
		case TV_BOOTS:
		case TV_GLOVES:
		case TV_HELM:
		case TV_CROWN:
		{
			if (randcalc(kind->to_a, 0, MINIMISE) < 0) return (false);
			return true;
		}

		/* Weapons -- Good unless damaged */
		case TV_BOW:
		case TV_SWORD:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_DIGGING:
		{
			if (randcalc(kind->to_h, 0, MINIMISE) < 0) return (false);
			if (randcalc(kind->to_d, 0, MINIMISE) < 0) return (false);
			return true;
		}

		/* Ammo -- Arrows/Bolts are good */
		case TV_BOLT:
		case TV_ARROW:
		{
			return true;
		}
	}

	/* Anything with the GOOD flag */
	if (kf_has(kind->kind_flags, KF_GOOD))
		return true;

	/* Assume not good */
	return (false);
}